

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

void pixels::compareExact(uint32_t a,uint32_t b,int x,int y,char *taga,char *tagb,char *chan)

{
  ostream *poVar1;
  char *func;
  
  if (a == b) {
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,chan);
  poVar1 = std::operator<<(poVar1," uint at ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,y);
  poVar1 = std::operator<<(poVar1," not equal: ");
  poVar1 = std::operator<<(poVar1,taga);
  poVar1 = std::operator<<(poVar1," 0x");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = std::operator<<(poVar1," vs ");
  poVar1 = std::operator<<(poVar1,tagb);
  poVar1 = std::operator<<(poVar1," 0x");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  func = *(char **)(*(long *)poVar1 + -0x18);
  *(uint *)(poVar1 + 0x18 + (long)func) = *(uint *)(poVar1 + 0x18 + (long)func) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar1);
  core_test_fail("a == b",(char *)0x1fb,0x156988,func);
}

Assistant:

static inline void compareExact (
        uint32_t    a,
        uint32_t    b,
        int         x,
        int         y,
        const char* taga,
        const char* tagb,
        const char* chan)
    {
        if (a != b)
        {
            std::cout << chan << " uint at " << x << ", " << y
                      << " not equal: " << taga << " 0x" << std::hex << a
                      << std::dec << " vs " << tagb << " 0x" << std::hex << b
                      << std::dec << std::endl;
        }
        EXRCORE_TEST (a == b);
    }